

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

void Gia_ManSortPairsInt(word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnatePairs,
                        Vec_Int_t *vUnatePairsW,Vec_Wec_t *vSorter)

{
  uint Entry;
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  size_t __size;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  
  iVar14 = (int)((long)nWords * 0x40);
  if (vSorter->nCap < iVar14) {
    if (vSorter->pArray == (Vec_Int_t *)0x0) {
      pVVar6 = (Vec_Int_t *)malloc((long)iVar14 << 4);
    }
    else {
      pVVar6 = (Vec_Int_t *)realloc(vSorter->pArray,(long)iVar14 << 4);
    }
    vSorter->pArray = pVVar6;
    memset(pVVar6 + vSorter->nCap,0,((long)nWords * 0x40 - (long)vSorter->nCap) * 0x10);
    vSorter->nCap = iVar14;
  }
  vSorter->nSize = iVar14;
  if (0 < vUnatePairs->nSize) {
    uVar15 = (ulong)(uint)nWords;
    lVar13 = 0;
    do {
      Entry = vUnatePairs->pArray[lVar13];
      if ((int)Entry < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      uVar11 = Entry >> 1 & 0x7fff;
      uVar4 = uVar11 >> 1;
      if ((vDivs->nSize <= (int)uVar4) || (vDivs->nSize <= (int)(Entry >> 0x11))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = vDivs->pArray[uVar4];
      pvVar2 = vDivs->pArray[Entry >> 0x11];
      if (uVar11 < Entry >> 0x10) {
        if ((Entry & 1) != 0) {
          __assert_fail("!fComp",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                        ,0x3ed,
                        "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                       );
        }
        uVar11 = Entry >> 1 & 1;
        uVar4 = Entry >> 0x10 & 1;
        if (uVar4 == 0 && uVar11 == 0) {
          if (nWords < 1) {
            uVar4 = 0;
          }
          else {
            uVar7 = 0;
            uVar4 = 0;
            do {
              uVar12 = *(ulong *)((long)pvVar1 + uVar7 * 8) & pOn[uVar7] &
                       *(ulong *)((long)pvVar2 + uVar7 * 8);
              uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
              uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
              uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
              uVar12 = (uVar12 >> 8) + uVar12;
              lVar10 = (uVar12 >> 0x10) + uVar12;
              uVar4 = uVar4 + ((int)((ulong)lVar10 >> 0x20) + (int)lVar10 & 0xffU);
              uVar7 = uVar7 + 1;
            } while (uVar15 != uVar7);
          }
        }
        else {
          bVar9 = (byte)uVar4;
          if (uVar11 == 0 || bVar9 != 0) {
            if ((uVar11 == 0 & bVar9) == 0) {
              if (nWords < 1) goto LAB_00794f81;
              uVar7 = 0;
              uVar4 = 0;
              do {
                uVar12 = ~(*(ulong *)((long)pvVar2 + uVar7 * 8) |
                          *(ulong *)((long)pvVar1 + uVar7 * 8)) & pOn[uVar7];
                uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
                uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
                uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
                uVar12 = (uVar12 >> 8) + uVar12;
                lVar10 = (uVar12 >> 0x10) + uVar12;
                uVar4 = uVar4 + ((int)((ulong)lVar10 >> 0x20) + (int)lVar10 & 0xffU);
                uVar7 = uVar7 + 1;
              } while (uVar15 != uVar7);
            }
            else {
              if (nWords < 1) goto LAB_00794f81;
              uVar7 = 0;
              uVar4 = 0;
              do {
                uVar12 = ~*(ulong *)((long)pvVar2 + uVar7 * 8) &
                         *(ulong *)((long)pvVar1 + uVar7 * 8) & pOn[uVar7];
                uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
                uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
                uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
                uVar12 = (uVar12 >> 8) + uVar12;
                lVar10 = (uVar12 >> 0x10) + uVar12;
                uVar4 = uVar4 + ((int)((ulong)lVar10 >> 0x20) + (int)lVar10 & 0xffU);
                uVar7 = uVar7 + 1;
              } while (uVar15 != uVar7);
            }
          }
          else {
            if (nWords < 1) goto LAB_00794f81;
            uVar7 = 0;
            uVar4 = 0;
            do {
              uVar12 = ~*(ulong *)((long)pvVar1 + uVar7 * 8) & pOn[uVar7] &
                       *(ulong *)((long)pvVar2 + uVar7 * 8);
              uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
              uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
              uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
              uVar12 = (uVar12 >> 8) + uVar12;
              lVar10 = (uVar12 >> 0x10) + uVar12;
              uVar4 = uVar4 + ((int)((ulong)lVar10 >> 0x20) + (int)lVar10 & 0xffU);
              uVar7 = uVar7 + 1;
            } while (uVar15 != uVar7);
          }
        }
      }
      else {
        if ((Entry & 2) != 0) {
          __assert_fail("!Abc_LitIsCompl(iLit0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                        ,0x3f3,
                        "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                       );
        }
        if ((Entry >> 0x10 & 1) != 0) {
          __assert_fail("!Abc_LitIsCompl(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                        ,0x3f4,
                        "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                       );
        }
        if ((Entry & 1) == 0) {
          if (nWords < 1) {
LAB_00794f81:
            uVar4 = 0;
          }
          else {
            uVar7 = 0;
            uVar4 = 0;
            do {
              uVar12 = (*(ulong *)((long)pvVar2 + uVar7 * 8) ^ *(ulong *)((long)pvVar1 + uVar7 * 8))
                       & pOn[uVar7];
              uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
              uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
              uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
              uVar12 = (uVar12 >> 8) + uVar12;
              lVar10 = (uVar12 >> 0x10) + uVar12;
              uVar4 = uVar4 + ((int)((ulong)lVar10 >> 0x20) + (int)lVar10 & 0xffU);
              uVar7 = uVar7 + 1;
            } while (uVar15 != uVar7);
          }
        }
        else {
          if (nWords < 1) goto LAB_00794f81;
          uVar7 = 0;
          uVar4 = 0;
          do {
            uVar12 = ~(*(ulong *)((long)pvVar1 + uVar7 * 8) ^ *(ulong *)((long)pvVar2 + uVar7 * 8))
                     & pOn[uVar7];
            uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
            uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
            uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
            uVar12 = (uVar12 >> 8) + uVar12;
            lVar10 = (uVar12 >> 0x10) + uVar12;
            uVar4 = uVar4 + ((int)((ulong)lVar10 >> 0x20) + (int)lVar10 & 0xffU);
            uVar7 = uVar7 + 1;
          } while (uVar15 != uVar7);
        }
      }
      if (vSorter->nSize <= (int)uVar4) {
        iVar14 = uVar4 + 1;
        iVar5 = vSorter->nSize * 2;
        if (iVar5 <= iVar14) {
          iVar5 = iVar14;
        }
        if (vSorter->nCap < iVar5) {
          __size = (long)iVar5 << 4;
          if (vSorter->pArray == (Vec_Int_t *)0x0) {
            pVVar6 = (Vec_Int_t *)malloc(__size);
          }
          else {
            pVVar6 = (Vec_Int_t *)realloc(vSorter->pArray,__size);
          }
          vSorter->pArray = pVVar6;
          memset(pVVar6 + vSorter->nCap,0,((long)iVar5 - (long)vSorter->nCap) * 0x10);
          vSorter->nCap = iVar5;
        }
        vSorter->nSize = iVar14;
      }
      if (((int)uVar4 < 0) || (vSorter->nSize <= (int)uVar4)) goto LAB_00795111;
      Vec_IntPush(vSorter->pArray + uVar4,Entry);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vUnatePairs->nSize);
  }
  vUnatePairs->nSize = 0;
  vUnatePairsW->nSize = 0;
  lVar13 = (long)vSorter->nSize;
  if (0 < (long)vSorter->nSize) {
    do {
      if (vSorter->nSize < lVar13) {
LAB_00795111:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar10 = lVar13 + -1;
      pVVar6 = vSorter->pArray;
      if (0 < pVVar6[lVar10].nSize) {
        lVar8 = 0;
        do {
          Vec_IntPush(vUnatePairs,pVVar6[lVar10].pArray[lVar8]);
          Vec_IntPush(vUnatePairsW,(int)lVar10);
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar6[lVar10].nSize);
      }
      bVar3 = 1 < lVar13;
      lVar13 = lVar10;
    } while (bVar3);
  }
  iVar14 = vSorter->nSize;
  if (0 < (long)iVar14) {
    pVVar6 = vSorter->pArray;
    lVar13 = 0;
    do {
      *(undefined4 *)((long)&pVVar6->nSize + lVar13) = 0;
      lVar13 = lVar13 + 0x10;
    } while ((long)iVar14 * 0x10 != lVar13);
  }
  vSorter->nSize = 0;
  return;
}

Assistant:

void Gia_ManSortPairsInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnatePairsW, Vec_Wec_t * vSorter )
{
    int i, k, iPair;
    Vec_Int_t * vLevel;
    Vec_WecInit( vSorter, nWords*64 );
    Vec_IntForEachEntry( vUnatePairs, iPair, i )
    {
        int fComp = Abc_LitIsCompl(iPair);
        int iLit0 = Abc_Lit2Var(iPair) & 0x7FFF;
        int iLit1 = Abc_Lit2Var(iPair) >> 15;
        word * pDiv0 = (word *)Vec_PtrEntry( vDivs, Abc_Lit2Var(iLit0) );
        word * pDiv1 = (word *)Vec_PtrEntry( vDivs, Abc_Lit2Var(iLit1) );
        if ( iLit0 < iLit1 )
        {
            assert( !fComp );
            //assert( !Abc_TtIntersectTwo( pOff, 0, pDiv0, Abc_LitIsCompl(iLit0), pDiv1, Abc_LitIsCompl(iLit1), nWords ) );
            Vec_WecPush( vSorter, Abc_TtCountOnesVecMask2(pDiv0, pDiv1, Abc_LitIsCompl(iLit0), Abc_LitIsCompl(iLit1), pOn, nWords), iPair );
        }
        else
        {
            assert( !Abc_LitIsCompl(iLit0) );
            assert( !Abc_LitIsCompl(iLit1) );
            //assert( !Abc_TtIntersectXor( pOff, 0, pDiv0, pDiv1, fComp, nWords ) );
            Vec_WecPush( vSorter, Abc_TtCountOnesVecXorMask(pDiv0, pDiv1, fComp, pOn, nWords), iPair );
        }
    }
    Vec_IntClear( vUnatePairs );
    Vec_IntClear( vUnatePairsW );
    Vec_WecForEachLevelReverse( vSorter, vLevel, k )
        Vec_IntForEachEntry( vLevel, iPair, i )
        {
            Vec_IntPush( vUnatePairs, iPair );
            Vec_IntPush( vUnatePairsW, k );
        }
    //Vec_IntPrint( Vec_WecEntry(vSorter, 0) );
    Vec_WecClear( vSorter );

}